

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::_evaluateResult<double>
          (SoPlexBase<double> *this,SPxSolverBase<double> *solver,Status result,bool usingRefinedLP,
          SolRational *sol,VectorBase<double> *dualReal,bool *infeasible,bool *unbounded,
          bool *stoppedTime,bool *stoppedIter,bool *error)

{
  double dVar1;
  Verbosity VVar2;
  Statistics *pSVar3;
  Verbosity old_verbosity;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Real extraout_XMM0_Qa;
  
  dVar1 = this->_statistics->fpTime;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    this->_statistics->fpTime = extraout_XMM0_Qa;
  }
  pSVar3 = this->_statistics;
  if (pSVar3->iterationsFP == 0) {
    pSVar3->iterationsFP = pSVar3->iterations;
  }
  switch(result) {
  case OPTIMAL:
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Floating-point optimal.\n",0x18);
      (this->spxout).m_verbosity = VVar2;
    }
    return false;
  case UNBOUNDED:
    VVar2 = (this->spxout).m_verbosity;
    error = unbounded;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Floating-point unbounded.\n",0x1a);
      (this->spxout).m_verbosity = VVar2;
    }
    break;
  case INFEASIBLE:
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Floating-point infeasible.\n",0x1b);
      (this->spxout).m_verbosity = VVar2;
    }
    error = infeasible;
    if ((usingRefinedLP) || (this->_hasBasis == true)) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                   *)&sol->_dualFarkas,dualReal);
      sol->field_0xd0 = sol->field_0xd0 | 8;
    }
    else {
      sol->field_0xd0 = sol->field_0xd0 & 0xf7;
    }
    break;
  case ABORT_TIME:
    *stoppedTime = true;
    return true;
  case ABORT_ITER:
    error = stoppedIter;
    break;
  default:
  }
  if (usingRefinedLP) {
    (*(solver->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x3e])(solver);
  }
  *error = true;
  return true;
}

Assistant:

bool SoPlexBase<R>::_evaluateResult(
   SPxSolverBase<T>& solver,
   typename SPxSolverBase<T>::Status result,
   bool usingRefinedLP,
   SolRational& sol,
   VectorBase<T>& dualReal,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   // we always evaluate the result after a solve so the first time is a good place to
   // set the fp Time
   if(_statistics->fpTime == 0)
      _statistics->fpTime = _statistics->solvingTime->time();

   if(_statistics->iterationsFP == 0)
      _statistics->iterationsFP = _statistics->iterations;

   switch(result)
   {
   case SPxSolverBase<T>::OPTIMAL:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point optimal.\n");
      return false;

   case SPxSolverBase<T>::INFEASIBLE:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point infeasible.\n");

      // when not using refined LP
      // the floating-point solve returns a Farkas ray if and only if the simplifier was not used, which is exactly
      // the case when a basis could be returned
      if(usingRefinedLP || _hasBasis)
      {
         sol._dualFarkas = dualReal;
         sol._hasDualFarkas = true;
      }
      else
         sol._hasDualFarkas = false;

      if(usingRefinedLP)
         solver.clearRowObjs();

      infeasible = true;
      return true;

   case SPxSolverBase<T>::UNBOUNDED:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point unbounded.\n");

      if(usingRefinedLP)
         solver.clearRowObjs();

      unbounded = true;
      return true;

   case SPxSolverBase<T>::ABORT_TIME:
      stoppedTime = true;
      return true;

   case SPxSolverBase<T>::ABORT_ITER:
      if(usingRefinedLP)
         solver.clearRowObjs();

      stoppedIter = true;
      return true;

   default:
      if(usingRefinedLP)
         solver.clearRowObjs();

      error = true;
      return true;
   }
}